

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdefaultrt.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnter(SPxDefaultRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *max,int param_2,bool param_3)

{
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  uint *puVar1;
  long lVar2;
  undefined8 uVar3;
  type_conflict5 tVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  double *pdVar8;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  DataKey DVar9;
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  cpp_dec_float<100U,_int,_void> *pcVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  uint local_2a0;
  uint local_29c;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  DataKey local_230;
  SPxId enterId;
  cpp_dec_float<100U,_int,_void> local_208;
  long local_1b8;
  long local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<100U,_int,_void> local_108;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  epsilon;
  
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])
                    (this,max,CONCAT44(in_register_00000014,param_2),
                     CONCAT71(in_register_00000009,param_3));
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var,iVar6) + 0xc38) + 0x68));
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(*(long *)(CONCAT44(extraout_var_00,iVar6) + 0xc40) + 0x68));
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_1b8 = **(long **)(CONCAT44(extraout_var_01,iVar6) + 0xc40);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar15 = *(long *)(*(long *)(CONCAT44(extraout_var_02,iVar6) + 0xc40) + 0x88);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar14 = *(long *)(CONCAT44(extraout_var_03,iVar6) + 0xc40);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_b0 = **(long **)(CONCAT44(extraout_var_04,iVar6) + 0xc60);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_b8 = **(long **)(CONCAT44(extraout_var_05,iVar6) + 0xc58);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_1b0 = **(long **)(CONCAT44(extraout_var_06,iVar6) + 0xc38);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar11 = *(long *)(*(long *)(CONCAT44(extraout_var_07,iVar6) + 0xc38) + 0x88);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  lVar2 = *(long *)(CONCAT44(extraout_var_08,iVar6) + 0xc38);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_a0 = **(long **)(CONCAT44(extraout_var_09,iVar6) + 0xc70);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  local_a8 = **(long **)(CONCAT44(extraout_var_10,iVar6) + 0xc68);
  iVar6 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::epsilon(&epsilon,(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)CONCAT44(extraout_var_11,iVar6));
  local_208.data._M_elems._0_8_ = *(undefined8 *)(max->m_backend).data._M_elems;
  local_208.data._M_elems._8_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 2);
  local_208.data._M_elems._16_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 4);
  local_208.data._M_elems._24_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 6);
  local_208.data._M_elems._32_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 8);
  local_208.data._M_elems._40_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 10);
  local_208.data._M_elems._48_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 0xc);
  local_208.data._M_elems._56_8_ = *(undefined8 *)((max->m_backend).data._M_elems + 0xe);
  local_208.exp = (max->m_backend).exp;
  local_208.neg = (max->m_backend).neg;
  local_208.fpclass = (max->m_backend).fpclass;
  local_208.prec_elem = (max->m_backend).prec_elem;
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  local_108.fpclass = cpp_dec_float_finite;
  local_108.prec_elem = 0x10;
  local_108.data._M_elems[0] = 0;
  local_108.data._M_elems[1] = 0;
  local_108.data._M_elems[2] = 0;
  local_108.data._M_elems[3] = 0;
  local_108.data._M_elems[4] = 0;
  local_108.data._M_elems[5] = 0;
  local_108.data._M_elems[6] = 0;
  local_108.data._M_elems[7] = 0;
  local_108.data._M_elems[8] = 0;
  local_108.data._M_elems[9] = 0;
  local_108.data._M_elems[10] = 0;
  local_108.data._M_elems[0xb] = 0;
  local_108.data._M_elems[0xc] = 0;
  local_108.data._M_elems[0xd] = 0;
  local_108.data._M_elems._56_5_ = 0;
  local_108.data._M_elems[0xf]._1_3_ = 0;
  local_108.exp = 0;
  local_108.neg = false;
  y.m_backend.data._M_elems._0_8_ = (ulong)y.m_backend.data._M_elems[1] << 0x20;
  tVar4 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_208,(int *)&y);
  v = &(this->
       super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
       ).delta;
  local_2a0 = 0xffffffff;
  local_98 = lVar11;
  if (tVar4) {
    local_230.info = 0;
    local_230.idx = 0;
    for (lVar11 = 0; lVar11 < *(int *)(lVar14 + 0x70); lVar11 = lVar11 + 1) {
      iVar6 = *(int *)(*(long *)(lVar14 + 0x78) + lVar11 * 4);
      lVar12 = (long)iVar6 * 0x50;
      local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar15 + lVar12);
      local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar15 + lVar12) + 2);
      puVar1 = (uint *)(lVar15 + 0x10 + lVar12);
      local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_108.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(lVar15 + 0x20 + lVar12);
      local_108.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_108.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(lVar15 + 0x30 + lVar12);
      local_108.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_108.data._M_elems._56_5_ = SUB85(uVar3,0);
      local_108.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_108.exp = *(int *)(lVar15 + 0x40 + lVar12);
      local_108.neg = *(bool *)(lVar15 + 0x44 + lVar12);
      local_108._72_8_ = *(undefined8 *)(lVar15 + 0x48 + lVar12);
      tVar4 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_108,&epsilon);
      if (tVar4) {
        pcVar10 = (cpp_dec_float<100U,_int,_void> *)(local_b8 + lVar12);
        pdVar8 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (&y.m_backend,*pdVar8,(type *)0x0);
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar10,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar4) {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems._56_5_ = 0;
          result.m_backend.data._M_elems[0xf]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&result.m_backend,pcVar10,
                     (cpp_dec_float<100U,_int,_void> *)(lVar12 + local_1b8));
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems._56_5_ = 0;
          result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&result_1.m_backend,&result.m_backend,&v->m_backend);
LAB_00370976:
          y.m_backend.fpclass = cpp_dec_float_finite;
          y.m_backend.prec_elem = 0x10;
          y.m_backend.data._M_elems[0] = 0;
          y.m_backend.data._M_elems[1] = 0;
          y.m_backend.data._M_elems[2] = 0;
          y.m_backend.data._M_elems[3] = 0;
          y.m_backend.data._M_elems[4] = 0;
          y.m_backend.data._M_elems[5] = 0;
          y.m_backend.data._M_elems[6] = 0;
          y.m_backend.data._M_elems[7] = 0;
          y.m_backend.data._M_elems[8] = 0;
          y.m_backend.data._M_elems[9] = 0;
          y.m_backend.data._M_elems[10] = 0;
          y.m_backend.data._M_elems[0xb] = 0;
          y.m_backend.data._M_elems[0xc] = 0;
          y.m_backend.data._M_elems[0xd] = 0;
          y.m_backend.data._M_elems._56_5_ = 0;
          y.m_backend.data._M_elems[0xf]._1_3_ = 0;
          y.m_backend.exp = 0;
          y.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&y.m_backend,&result_1.m_backend,&local_108);
          tVar4 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_208);
          if (tVar4) {
            iVar7 = (*(this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )._vptr_SPxRatioTester[3])();
            local_230 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)CONCAT44(extraout_var_12,iVar7),iVar6);
            local_208.data._M_elems[0xf]._1_3_ = y.m_backend.data._M_elems[0xf]._1_3_;
            local_208.data._M_elems._56_5_ = y.m_backend.data._M_elems._56_5_;
            local_208.data._M_elems[0] = y.m_backend.data._M_elems[0];
            local_208.data._M_elems[1] = y.m_backend.data._M_elems[1];
            local_208.data._M_elems[2] = y.m_backend.data._M_elems[2];
            local_208.data._M_elems[3] = y.m_backend.data._M_elems[3];
            local_208.data._M_elems[4] = y.m_backend.data._M_elems[4];
            local_208.data._M_elems[5] = y.m_backend.data._M_elems[5];
            local_208.data._M_elems[6] = y.m_backend.data._M_elems[6];
            local_208.data._M_elems[7] = y.m_backend.data._M_elems[7];
            local_208.data._M_elems[8] = y.m_backend.data._M_elems[8];
            local_208.data._M_elems[9] = y.m_backend.data._M_elems[9];
            local_208.data._M_elems[10] = y.m_backend.data._M_elems[10];
            local_208.data._M_elems[0xb] = y.m_backend.data._M_elems[0xb];
            local_208.data._M_elems[0xc] = y.m_backend.data._M_elems[0xc];
            local_208.data._M_elems[0xd] = y.m_backend.data._M_elems[0xd];
            local_208.exp = y.m_backend.exp;
            local_208.neg = y.m_backend.neg;
            local_208.fpclass = y.m_backend.fpclass;
            local_208.prec_elem = y.m_backend.prec_elem;
            local_2a0 = (uint)lVar11;
            enterId.super_DataKey = local_230;
          }
        }
      }
      else {
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        y.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
        uVar3 = y.m_backend.data._M_elems._0_8_;
        y.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
        y.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
        y.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[0xc];
        y.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[0xd];
        y.m_backend.data._M_elems._56_5_ = epsilon.m_backend.data._M_elems._56_5_;
        y.m_backend.data._M_elems[0xf]._1_3_ = epsilon.m_backend.data._M_elems[0xf]._1_3_;
        y.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
        y.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
        y.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[10];
        y.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[0xb];
        y.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
        y.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
        y.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
        y.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
        y.m_backend.exp = epsilon.m_backend.exp;
        y.m_backend.neg = epsilon.m_backend.neg;
        y.m_backend.fpclass = epsilon.m_backend.fpclass;
        y.m_backend.prec_elem = epsilon.m_backend.prec_elem;
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        if (epsilon.m_backend.fpclass != cpp_dec_float_finite || y.m_backend.data._M_elems[0] != 0)
        {
          y.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
        }
        y.m_backend.data._M_elems._0_8_ = uVar3;
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_108,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar4) {
          pcVar10 = (cpp_dec_float<100U,_int,_void> *)(local_b0 + lVar12);
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&y.m_backend,-*pdVar8,(type *)0x0);
          tVar4 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pcVar10,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend);
          if (tVar4) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems._56_5_ = 0;
            result.m_backend.data._M_elems[0xf]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&result.m_backend,pcVar10,
                       (cpp_dec_float<100U,_int,_void> *)(lVar12 + local_1b8));
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems._56_5_ = 0;
            result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&result_1.m_backend,&result.m_backend,&v->m_backend);
            goto LAB_00370976;
          }
        }
      }
    }
    local_29c = 0xffffffff;
    lVar11 = 0;
    while( true ) {
      if (*(int *)(lVar2 + 0x70) <= lVar11) break;
      iVar6 = *(int *)(*(long *)(lVar2 + 0x78) + lVar11 * 4);
      lVar12 = (long)iVar6 * 0x50;
      local_108.data._M_elems._0_8_ = *(undefined8 *)(local_98 + lVar12);
      local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(local_98 + lVar12) + 2);
      puVar1 = (uint *)(local_98 + 0x10 + lVar12);
      local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_108.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(local_98 + 0x20 + lVar12);
      local_108.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_108.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(local_98 + 0x30 + lVar12);
      local_108.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_108.data._M_elems._56_5_ = SUB85(uVar3,0);
      local_108.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_108.exp = *(int *)(local_98 + 0x40 + lVar12);
      local_108.neg = *(bool *)(local_98 + 0x44 + lVar12);
      local_108._72_8_ = *(undefined8 *)(local_98 + 0x48 + lVar12);
      tVar4 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_108,&epsilon);
      if (tVar4) {
        pcVar10 = (cpp_dec_float<100U,_int,_void> *)(local_a8 + lVar12);
        pdVar8 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (&y.m_backend,*pdVar8,(type *)0x0);
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar10,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar4) {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems._56_5_ = 0;
          result.m_backend.data._M_elems[0xf]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&result.m_backend,pcVar10,
                     (cpp_dec_float<100U,_int,_void> *)(lVar12 + local_1b0));
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems._56_5_ = 0;
          result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&result_1.m_backend,&result.m_backend,&v->m_backend);
LAB_00370d49:
          y.m_backend.fpclass = cpp_dec_float_finite;
          y.m_backend.prec_elem = 0x10;
          y.m_backend.data._M_elems[0] = 0;
          y.m_backend.data._M_elems[1] = 0;
          y.m_backend.data._M_elems[2] = 0;
          y.m_backend.data._M_elems[3] = 0;
          y.m_backend.data._M_elems[4] = 0;
          y.m_backend.data._M_elems[5] = 0;
          y.m_backend.data._M_elems[6] = 0;
          y.m_backend.data._M_elems[7] = 0;
          y.m_backend.data._M_elems[8] = 0;
          y.m_backend.data._M_elems[9] = 0;
          y.m_backend.data._M_elems[10] = 0;
          y.m_backend.data._M_elems[0xb] = 0;
          y.m_backend.data._M_elems[0xc] = 0;
          y.m_backend.data._M_elems[0xd] = 0;
          y.m_backend.data._M_elems._56_5_ = 0;
          y.m_backend.data._M_elems[0xf]._1_3_ = 0;
          y.m_backend.exp = 0;
          y.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&y.m_backend,&result_1.m_backend,&local_108);
          tVar4 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_208);
          if (tVar4) {
            iVar7 = (*(this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )._vptr_SPxRatioTester[3])();
            local_230 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(extraout_var_13,iVar7),iVar6);
            local_208.data._M_elems[0xf]._1_3_ = y.m_backend.data._M_elems[0xf]._1_3_;
            local_208.data._M_elems._56_5_ = y.m_backend.data._M_elems._56_5_;
            local_208.data._M_elems[0] = y.m_backend.data._M_elems[0];
            local_208.data._M_elems[1] = y.m_backend.data._M_elems[1];
            local_208.data._M_elems[2] = y.m_backend.data._M_elems[2];
            local_208.data._M_elems[3] = y.m_backend.data._M_elems[3];
            local_208.data._M_elems[4] = y.m_backend.data._M_elems[4];
            local_208.data._M_elems[5] = y.m_backend.data._M_elems[5];
            local_208.data._M_elems[6] = y.m_backend.data._M_elems[6];
            local_208.data._M_elems[7] = y.m_backend.data._M_elems[7];
            local_208.data._M_elems[8] = y.m_backend.data._M_elems[8];
            local_208.data._M_elems[9] = y.m_backend.data._M_elems[9];
            local_208.data._M_elems[10] = y.m_backend.data._M_elems[10];
            local_208.data._M_elems[0xb] = y.m_backend.data._M_elems[0xb];
            local_208.data._M_elems[0xc] = y.m_backend.data._M_elems[0xc];
            local_208.data._M_elems[0xd] = y.m_backend.data._M_elems[0xd];
            local_208.exp = y.m_backend.exp;
            local_208.neg = y.m_backend.neg;
            local_208.fpclass = y.m_backend.fpclass;
            local_208.prec_elem = y.m_backend.prec_elem;
            local_29c = (uint)lVar11;
            enterId.super_DataKey = local_230;
          }
        }
      }
      else {
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        y.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
        uVar3 = y.m_backend.data._M_elems._0_8_;
        y.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
        y.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
        y.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[0xc];
        y.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[0xd];
        y.m_backend.data._M_elems._56_5_ = epsilon.m_backend.data._M_elems._56_5_;
        y.m_backend.data._M_elems[0xf]._1_3_ = epsilon.m_backend.data._M_elems[0xf]._1_3_;
        y.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
        y.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
        y.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[10];
        y.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[0xb];
        y.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
        y.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
        y.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
        y.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
        y.m_backend.exp = epsilon.m_backend.exp;
        y.m_backend.neg = epsilon.m_backend.neg;
        y.m_backend.fpclass = epsilon.m_backend.fpclass;
        y.m_backend.prec_elem = epsilon.m_backend.prec_elem;
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        if (epsilon.m_backend.fpclass != cpp_dec_float_finite || y.m_backend.data._M_elems[0] != 0)
        {
          y.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
        }
        y.m_backend.data._M_elems._0_8_ = uVar3;
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_108,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar4) {
          pcVar10 = (cpp_dec_float<100U,_int,_void> *)(local_a0 + lVar12);
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&y.m_backend,-*pdVar8,(type *)0x0);
          tVar4 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pcVar10,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend);
          if (tVar4) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems._56_5_ = 0;
            result.m_backend.data._M_elems[0xf]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&result.m_backend,pcVar10,
                       (cpp_dec_float<100U,_int,_void> *)(lVar12 + local_1b0));
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems._56_5_ = 0;
            result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&result_1.m_backend,&result.m_backend,&v->m_backend);
            goto LAB_00370d49;
          }
        }
      }
      lVar11 = lVar11 + 1;
    }
    if (-1 < (int)local_29c) {
      lVar15 = (long)*(int *)(*(long *)(lVar2 + 0x78) + (ulong)local_29c * 4) * 0x50;
      local_108.data._M_elems._0_8_ = *(undefined8 *)(local_98 + lVar15);
      local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(local_98 + lVar15) + 2);
      puVar1 = (uint *)(local_98 + 0x10 + lVar15);
      local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_108.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(local_98 + 0x20 + lVar15);
      local_108.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_108.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(local_98 + 0x30 + lVar15);
      local_108.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_108.data._M_elems._56_5_ = SUB85(uVar3,0);
      local_108.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_108.exp = *(int *)(local_98 + 0x40 + lVar15);
      local_108.neg = *(bool *)(local_98 + 0x44 + lVar15);
      local_108._72_8_ = *(undefined8 *)(local_98 + 0x48 + lVar15);
      tVar4 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_108,&epsilon);
      goto LAB_003716cd;
    }
    if ((int)local_2a0 < 0) goto LAB_0037195b;
    lVar14 = (long)*(int *)(*(long *)(lVar14 + 0x78) + (ulong)local_2a0 * 4) * 0x50;
    local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar15 + lVar14);
    local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar15 + lVar14) + 2);
    puVar1 = (uint *)(lVar15 + 0x10 + lVar14);
    local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_108.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar15 + 0x20 + lVar14);
    local_108.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_108.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar15 + 0x30 + lVar14);
    local_108.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar3 = *(undefined8 *)(puVar1 + 2);
    local_108.data._M_elems._56_5_ = SUB85(uVar3,0);
    local_108.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_108.exp = *(int *)(lVar15 + 0x40 + lVar14);
    local_108.neg = *(bool *)(lVar15 + 0x44 + lVar14);
    local_108._72_8_ = *(undefined8 *)(lVar15 + 0x48 + lVar14);
    tVar4 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_108,&epsilon);
LAB_0037183c:
    lVar15 = local_b0;
    if (tVar4 != false) {
      lVar15 = local_b8;
    }
    local_208.data._M_elems._0_8_ = *(undefined8 *)(lVar15 + lVar14);
    local_208.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar15 + lVar14) + 2);
    puVar1 = (uint *)(lVar15 + 0x10 + lVar14);
    local_208.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_208.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar15 + 0x20 + lVar14);
    local_208.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_208.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar15 + 0x30 + lVar14);
    local_208.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_208.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_208.exp = *(int *)(lVar15 + 0x40 + lVar14);
    local_208.neg = *(bool *)(lVar15 + 0x44 + lVar14);
    local_208._72_8_ = *(undefined8 *)(lVar15 + 0x48 + lVar14);
    pcVar10 = (cpp_dec_float<100U,_int,_void> *)(local_1b8 + lVar14);
  }
  else {
    local_230.info = 0;
    local_230.idx = 0;
    for (lVar11 = 0; lVar12 = local_98, lVar11 < *(int *)(lVar14 + 0x70); lVar11 = lVar11 + 1) {
      iVar6 = *(int *)(*(long *)(lVar14 + 0x78) + lVar11 * 4);
      lVar12 = (long)iVar6 * 0x50;
      local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar15 + lVar12);
      local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar15 + lVar12) + 2);
      puVar1 = (uint *)(lVar15 + 0x10 + lVar12);
      local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_108.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(lVar15 + 0x20 + lVar12);
      local_108.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_108.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(lVar15 + 0x30 + lVar12);
      local_108.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_108.data._M_elems._56_5_ = SUB85(uVar3,0);
      local_108.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_108.exp = *(int *)(lVar15 + 0x40 + lVar12);
      local_108.neg = *(bool *)(lVar15 + 0x44 + lVar12);
      local_108._72_8_ = *(undefined8 *)(lVar15 + 0x48 + lVar12);
      tVar4 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_108,&epsilon);
      if (tVar4) {
        pcVar10 = (cpp_dec_float<100U,_int,_void> *)(local_b0 + lVar12);
        pdVar8 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (&y.m_backend,-*pdVar8,(type *)0x0);
        tVar4 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar10,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar4) {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems._56_5_ = 0;
          result.m_backend.data._M_elems[0xf]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&result.m_backend,pcVar10,
                     (cpp_dec_float<100U,_int,_void> *)(lVar12 + local_1b8));
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems._56_5_ = 0;
          result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&result_1.m_backend,&result.m_backend,&v->m_backend);
LAB_00371198:
          y.m_backend.fpclass = cpp_dec_float_finite;
          y.m_backend.prec_elem = 0x10;
          y.m_backend.data._M_elems[0] = 0;
          y.m_backend.data._M_elems[1] = 0;
          y.m_backend.data._M_elems[2] = 0;
          y.m_backend.data._M_elems[3] = 0;
          y.m_backend.data._M_elems[4] = 0;
          y.m_backend.data._M_elems[5] = 0;
          y.m_backend.data._M_elems[6] = 0;
          y.m_backend.data._M_elems[7] = 0;
          y.m_backend.data._M_elems[8] = 0;
          y.m_backend.data._M_elems[9] = 0;
          y.m_backend.data._M_elems[10] = 0;
          y.m_backend.data._M_elems[0xb] = 0;
          y.m_backend.data._M_elems[0xc] = 0;
          y.m_backend.data._M_elems[0xd] = 0;
          y.m_backend.data._M_elems._56_5_ = 0;
          y.m_backend.data._M_elems[0xf]._1_3_ = 0;
          y.m_backend.exp = 0;
          y.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&y.m_backend,&result_1.m_backend,&local_108);
          tVar4 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_208);
          if (tVar4) {
            iVar7 = (*(this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )._vptr_SPxRatioTester[3])();
            local_230 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ::id((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)CONCAT44(extraout_var_14,iVar7),iVar6);
            local_208.data._M_elems[0xf]._1_3_ = y.m_backend.data._M_elems[0xf]._1_3_;
            local_208.data._M_elems._56_5_ = y.m_backend.data._M_elems._56_5_;
            local_208.data._M_elems[0] = y.m_backend.data._M_elems[0];
            local_208.data._M_elems[1] = y.m_backend.data._M_elems[1];
            local_208.data._M_elems[2] = y.m_backend.data._M_elems[2];
            local_208.data._M_elems[3] = y.m_backend.data._M_elems[3];
            local_208.data._M_elems[4] = y.m_backend.data._M_elems[4];
            local_208.data._M_elems[5] = y.m_backend.data._M_elems[5];
            local_208.data._M_elems[6] = y.m_backend.data._M_elems[6];
            local_208.data._M_elems[7] = y.m_backend.data._M_elems[7];
            local_208.data._M_elems[8] = y.m_backend.data._M_elems[8];
            local_208.data._M_elems[9] = y.m_backend.data._M_elems[9];
            local_208.data._M_elems[10] = y.m_backend.data._M_elems[10];
            local_208.data._M_elems[0xb] = y.m_backend.data._M_elems[0xb];
            local_208.data._M_elems[0xc] = y.m_backend.data._M_elems[0xc];
            local_208.data._M_elems[0xd] = y.m_backend.data._M_elems[0xd];
            local_208.exp = y.m_backend.exp;
            local_208.neg = y.m_backend.neg;
            local_208.fpclass = y.m_backend.fpclass;
            local_208.prec_elem = y.m_backend.prec_elem;
            local_2a0 = (uint)lVar11;
            enterId.super_DataKey = local_230;
          }
        }
      }
      else {
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        y.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
        uVar3 = y.m_backend.data._M_elems._0_8_;
        y.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
        y.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
        y.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[0xc];
        y.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[0xd];
        y.m_backend.data._M_elems._56_5_ = epsilon.m_backend.data._M_elems._56_5_;
        y.m_backend.data._M_elems[0xf]._1_3_ = epsilon.m_backend.data._M_elems[0xf]._1_3_;
        y.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
        y.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
        y.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[10];
        y.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[0xb];
        y.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
        y.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
        y.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
        y.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
        y.m_backend.exp = epsilon.m_backend.exp;
        y.m_backend.neg = epsilon.m_backend.neg;
        y.m_backend.fpclass = epsilon.m_backend.fpclass;
        y.m_backend.prec_elem = epsilon.m_backend.prec_elem;
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        if (epsilon.m_backend.fpclass != cpp_dec_float_finite || y.m_backend.data._M_elems[0] != 0)
        {
          y.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
        }
        y.m_backend.data._M_elems._0_8_ = uVar3;
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_108,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar4) {
          pcVar10 = (cpp_dec_float<100U,_int,_void> *)(local_b8 + lVar12);
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&y.m_backend,*pdVar8,(type *)0x0);
          tVar4 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pcVar10,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend);
          if (tVar4) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems._56_5_ = 0;
            result.m_backend.data._M_elems[0xf]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&result.m_backend,pcVar10,
                       (cpp_dec_float<100U,_int,_void> *)(lVar12 + local_1b8));
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems._56_5_ = 0;
            result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&result_1.m_backend,&result.m_backend,&v->m_backend);
            goto LAB_00371198;
          }
        }
      }
    }
    local_29c = 0xffffffff;
    lVar11 = 0;
    while( true ) {
      if (*(int *)(lVar2 + 0x70) <= lVar11) break;
      iVar6 = *(int *)(*(long *)(lVar2 + 0x78) + lVar11 * 4);
      lVar13 = (long)iVar6 * 0x50;
      local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar12 + lVar13);
      local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar12 + lVar13) + 2);
      puVar1 = (uint *)(lVar12 + 0x10 + lVar13);
      local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_108.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(lVar12 + 0x20 + lVar13);
      local_108.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_108.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(lVar12 + 0x30 + lVar13);
      local_108.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_108.data._M_elems._56_5_ = SUB85(uVar3,0);
      local_108.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_108.exp = *(int *)(lVar12 + 0x40 + lVar13);
      local_108.neg = *(bool *)(lVar12 + 0x44 + lVar13);
      local_108._72_8_ = *(undefined8 *)(lVar12 + 0x48 + lVar13);
      tVar4 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_108,&epsilon);
      if (tVar4) {
        pcVar10 = (cpp_dec_float<100U,_int,_void> *)(local_a0 + lVar13);
        pdVar8 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                  (&y.m_backend,-*pdVar8,(type *)0x0);
        tVar4 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)pcVar10,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar4) {
          result.m_backend.fpclass = cpp_dec_float_finite;
          result.m_backend.prec_elem = 0x10;
          result.m_backend.data._M_elems[0] = 0;
          result.m_backend.data._M_elems[1] = 0;
          result.m_backend.data._M_elems[2] = 0;
          result.m_backend.data._M_elems[3] = 0;
          result.m_backend.data._M_elems[4] = 0;
          result.m_backend.data._M_elems[5] = 0;
          result.m_backend.data._M_elems[6] = 0;
          result.m_backend.data._M_elems[7] = 0;
          result.m_backend.data._M_elems[8] = 0;
          result.m_backend.data._M_elems[9] = 0;
          result.m_backend.data._M_elems[10] = 0;
          result.m_backend.data._M_elems[0xb] = 0;
          result.m_backend.data._M_elems[0xc] = 0;
          result.m_backend.data._M_elems[0xd] = 0;
          result.m_backend.data._M_elems._56_5_ = 0;
          result.m_backend.data._M_elems[0xf]._1_3_ = 0;
          result.m_backend.exp = 0;
          result.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&result.m_backend,pcVar10,
                     (cpp_dec_float<100U,_int,_void> *)(lVar13 + local_1b0));
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x10;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems._56_5_ = 0;
          result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&result_1.m_backend,&result.m_backend,&v->m_backend);
LAB_0037157a:
          y.m_backend.fpclass = cpp_dec_float_finite;
          y.m_backend.prec_elem = 0x10;
          y.m_backend.data._M_elems[0] = 0;
          y.m_backend.data._M_elems[1] = 0;
          y.m_backend.data._M_elems[2] = 0;
          y.m_backend.data._M_elems[3] = 0;
          y.m_backend.data._M_elems[4] = 0;
          y.m_backend.data._M_elems[5] = 0;
          y.m_backend.data._M_elems[6] = 0;
          y.m_backend.data._M_elems[7] = 0;
          y.m_backend.data._M_elems[8] = 0;
          y.m_backend.data._M_elems[9] = 0;
          y.m_backend.data._M_elems[10] = 0;
          y.m_backend.data._M_elems[0xb] = 0;
          y.m_backend.data._M_elems[0xc] = 0;
          y.m_backend.data._M_elems[0xd] = 0;
          y.m_backend.data._M_elems._56_5_ = 0;
          y.m_backend.data._M_elems[0xf]._1_3_ = 0;
          y.m_backend.exp = 0;
          y.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&y.m_backend,&result_1.m_backend,&local_108);
          tVar4 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_208);
          if (tVar4) {
            iVar7 = (*(this->
                      super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      )._vptr_SPxRatioTester[3])();
            local_230 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ::coId((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                         *)CONCAT44(extraout_var_15,iVar7),iVar6);
            local_208.data._M_elems[0xf]._1_3_ = y.m_backend.data._M_elems[0xf]._1_3_;
            local_208.data._M_elems._56_5_ = y.m_backend.data._M_elems._56_5_;
            local_208.data._M_elems[0] = y.m_backend.data._M_elems[0];
            local_208.data._M_elems[1] = y.m_backend.data._M_elems[1];
            local_208.data._M_elems[2] = y.m_backend.data._M_elems[2];
            local_208.data._M_elems[3] = y.m_backend.data._M_elems[3];
            local_208.data._M_elems[4] = y.m_backend.data._M_elems[4];
            local_208.data._M_elems[5] = y.m_backend.data._M_elems[5];
            local_208.data._M_elems[6] = y.m_backend.data._M_elems[6];
            local_208.data._M_elems[7] = y.m_backend.data._M_elems[7];
            local_208.data._M_elems[8] = y.m_backend.data._M_elems[8];
            local_208.data._M_elems[9] = y.m_backend.data._M_elems[9];
            local_208.data._M_elems[10] = y.m_backend.data._M_elems[10];
            local_208.data._M_elems[0xb] = y.m_backend.data._M_elems[0xb];
            local_208.data._M_elems[0xc] = y.m_backend.data._M_elems[0xc];
            local_208.data._M_elems[0xd] = y.m_backend.data._M_elems[0xd];
            local_208.exp = y.m_backend.exp;
            local_208.neg = y.m_backend.neg;
            local_208.fpclass = y.m_backend.fpclass;
            local_208.prec_elem = y.m_backend.prec_elem;
            local_29c = (uint)lVar11;
            enterId.super_DataKey = local_230;
          }
        }
      }
      else {
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        y.m_backend.data._M_elems[1] = epsilon.m_backend.data._M_elems[1];
        uVar3 = y.m_backend.data._M_elems._0_8_;
        y.m_backend.data._M_elems[2] = epsilon.m_backend.data._M_elems[2];
        y.m_backend.data._M_elems[3] = epsilon.m_backend.data._M_elems[3];
        y.m_backend.data._M_elems[0xc] = epsilon.m_backend.data._M_elems[0xc];
        y.m_backend.data._M_elems[0xd] = epsilon.m_backend.data._M_elems[0xd];
        y.m_backend.data._M_elems._56_5_ = epsilon.m_backend.data._M_elems._56_5_;
        y.m_backend.data._M_elems[0xf]._1_3_ = epsilon.m_backend.data._M_elems[0xf]._1_3_;
        y.m_backend.data._M_elems[8] = epsilon.m_backend.data._M_elems[8];
        y.m_backend.data._M_elems[9] = epsilon.m_backend.data._M_elems[9];
        y.m_backend.data._M_elems[10] = epsilon.m_backend.data._M_elems[10];
        y.m_backend.data._M_elems[0xb] = epsilon.m_backend.data._M_elems[0xb];
        y.m_backend.data._M_elems[4] = epsilon.m_backend.data._M_elems[4];
        y.m_backend.data._M_elems[5] = epsilon.m_backend.data._M_elems[5];
        y.m_backend.data._M_elems[6] = epsilon.m_backend.data._M_elems[6];
        y.m_backend.data._M_elems[7] = epsilon.m_backend.data._M_elems[7];
        y.m_backend.exp = epsilon.m_backend.exp;
        y.m_backend.neg = epsilon.m_backend.neg;
        y.m_backend.fpclass = epsilon.m_backend.fpclass;
        y.m_backend.prec_elem = epsilon.m_backend.prec_elem;
        y.m_backend.data._M_elems[0] = epsilon.m_backend.data._M_elems[0];
        if (epsilon.m_backend.fpclass != cpp_dec_float_finite || y.m_backend.data._M_elems[0] != 0)
        {
          y.m_backend.neg = (bool)(epsilon.m_backend.neg ^ 1);
        }
        y.m_backend.data._M_elems._0_8_ = uVar3;
        tVar4 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_108,
                           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar4) {
          pcVar10 = (cpp_dec_float<100U,_int,_void> *)(local_a8 + lVar13);
          pdVar8 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<double>
                    (&y.m_backend,*pdVar8,(type *)0x0);
          tVar4 = boost::multiprecision::operator<
                            ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)pcVar10,
                             (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend);
          if (tVar4) {
            result.m_backend.fpclass = cpp_dec_float_finite;
            result.m_backend.prec_elem = 0x10;
            result.m_backend.data._M_elems[0] = 0;
            result.m_backend.data._M_elems[1] = 0;
            result.m_backend.data._M_elems[2] = 0;
            result.m_backend.data._M_elems[3] = 0;
            result.m_backend.data._M_elems[4] = 0;
            result.m_backend.data._M_elems[5] = 0;
            result.m_backend.data._M_elems[6] = 0;
            result.m_backend.data._M_elems[7] = 0;
            result.m_backend.data._M_elems[8] = 0;
            result.m_backend.data._M_elems[9] = 0;
            result.m_backend.data._M_elems[10] = 0;
            result.m_backend.data._M_elems[0xb] = 0;
            result.m_backend.data._M_elems[0xc] = 0;
            result.m_backend.data._M_elems[0xd] = 0;
            result.m_backend.data._M_elems._56_5_ = 0;
            result.m_backend.data._M_elems[0xf]._1_3_ = 0;
            result.m_backend.exp = 0;
            result.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&result.m_backend,pcVar10,
                       (cpp_dec_float<100U,_int,_void> *)(lVar13 + local_1b0));
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x10;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems._56_5_ = 0;
            result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                      (&result_1.m_backend,&result.m_backend,&v->m_backend);
            goto LAB_0037157a;
          }
        }
      }
      lVar11 = lVar11 + 1;
    }
    if ((int)local_29c < 0) {
      if ((int)local_2a0 < 0) goto LAB_0037195b;
      lVar14 = (long)*(int *)(*(long *)(lVar14 + 0x78) + (ulong)local_2a0 * 4) * 0x50;
      local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar15 + lVar14);
      local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar15 + lVar14) + 2);
      puVar1 = (uint *)(lVar15 + 0x10 + lVar14);
      local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_108.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(lVar15 + 0x20 + lVar14);
      local_108.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_108.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)(lVar15 + 0x30 + lVar14);
      local_108.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar3 = *(undefined8 *)(puVar1 + 2);
      local_108.data._M_elems._56_5_ = SUB85(uVar3,0);
      local_108.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
      local_108.exp = *(int *)(lVar15 + 0x40 + lVar14);
      local_108.neg = *(bool *)(lVar15 + 0x44 + lVar14);
      local_108._72_8_ = *(undefined8 *)(lVar15 + 0x48 + lVar14);
      tVar4 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_108,&epsilon);
      goto LAB_0037183c;
    }
    lVar15 = (long)*(int *)(*(long *)(lVar2 + 0x78) + (ulong)local_29c * 4) * 0x50;
    local_108.data._M_elems._0_8_ = *(undefined8 *)(lVar12 + lVar15);
    local_108.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar12 + lVar15) + 2);
    puVar1 = (uint *)(lVar12 + 0x10 + lVar15);
    local_108.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_108.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar12 + 0x20 + lVar15);
    local_108.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_108.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar12 + 0x30 + lVar15);
    local_108.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    uVar3 = *(undefined8 *)(puVar1 + 2);
    local_108.data._M_elems._56_5_ = SUB85(uVar3,0);
    local_108.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar3 >> 0x28);
    local_108.exp = *(int *)(lVar12 + 0x40 + lVar15);
    local_108.neg = *(bool *)(lVar12 + 0x44 + lVar15);
    local_108._72_8_ = *(undefined8 *)(lVar12 + 0x48 + lVar15);
    tVar4 = boost::multiprecision::operator<
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_108,&epsilon);
LAB_003716cd:
    lVar14 = local_a0;
    if (tVar4 != false) {
      lVar14 = local_a8;
    }
    local_208.data._M_elems._0_8_ = *(undefined8 *)(lVar14 + lVar15);
    local_208.data._M_elems._8_8_ = *(undefined8 *)((uint *)(lVar14 + lVar15) + 2);
    puVar1 = (uint *)(lVar14 + 0x10 + lVar15);
    local_208.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_208.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar14 + 0x20 + lVar15);
    local_208.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_208.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = (uint *)(lVar14 + 0x30 + lVar15);
    local_208.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_208.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_208.exp = *(int *)(lVar14 + 0x40 + lVar15);
    local_208.neg = *(bool *)(lVar14 + 0x44 + lVar15);
    local_208._72_8_ = *(undefined8 *)(lVar14 + 0x48 + lVar15);
    pcVar10 = (cpp_dec_float<100U,_int,_void> *)(local_1b0 + lVar15);
  }
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 0x10;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems[6] = 0;
  result_1.m_backend.data._M_elems[7] = 0;
  result_1.m_backend.data._M_elems[8] = 0;
  result_1.m_backend.data._M_elems[9] = 0;
  result_1.m_backend.data._M_elems[10] = 0;
  result_1.m_backend.data._M_elems[0xb] = 0;
  result_1.m_backend.data._M_elems[0xc] = 0;
  result_1.m_backend.data._M_elems[0xd] = 0;
  result_1.m_backend.data._M_elems._56_5_ = 0;
  result_1.m_backend.data._M_elems[0xf]._1_3_ = 0;
  result_1.m_backend.exp = 0;
  result_1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&result_1.m_backend,&local_208,pcVar10);
  y.m_backend.fpclass = cpp_dec_float_finite;
  y.m_backend.prec_elem = 0x10;
  y.m_backend.data._M_elems[0] = 0;
  y.m_backend.data._M_elems[1] = 0;
  y.m_backend.data._M_elems[2] = 0;
  y.m_backend.data._M_elems[3] = 0;
  y.m_backend.data._M_elems[4] = 0;
  y.m_backend.data._M_elems[5] = 0;
  y.m_backend.data._M_elems[6] = 0;
  y.m_backend.data._M_elems[7] = 0;
  y.m_backend.data._M_elems[8] = 0;
  y.m_backend.data._M_elems[9] = 0;
  y.m_backend.data._M_elems[10] = 0;
  y.m_backend.data._M_elems[0xb] = 0;
  y.m_backend.data._M_elems[0xc] = 0;
  y.m_backend.data._M_elems[0xd] = 0;
  y.m_backend.data._M_elems._56_5_ = 0;
  y.m_backend.data._M_elems[0xf]._1_3_ = 0;
  y.m_backend.exp = 0;
  y.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
            (&y.m_backend,&result_1.m_backend,&local_108);
  local_208.data._M_elems[0xf]._1_3_ = y.m_backend.data._M_elems[0xf]._1_3_;
  local_208.data._M_elems._56_5_ = y.m_backend.data._M_elems._56_5_;
  local_208.data._M_elems[0xc] = y.m_backend.data._M_elems[0xc];
  local_208.data._M_elems[0xd] = y.m_backend.data._M_elems[0xd];
  local_208.data._M_elems[8] = y.m_backend.data._M_elems[8];
  local_208.data._M_elems[9] = y.m_backend.data._M_elems[9];
  local_208.data._M_elems[10] = y.m_backend.data._M_elems[10];
  local_208.data._M_elems[0xb] = y.m_backend.data._M_elems[0xb];
  local_208.data._M_elems[4] = y.m_backend.data._M_elems[4];
  local_208.data._M_elems[5] = y.m_backend.data._M_elems[5];
  local_208.data._M_elems[6] = y.m_backend.data._M_elems[6];
  local_208.data._M_elems[7] = y.m_backend.data._M_elems[7];
  local_208.data._M_elems[0] = y.m_backend.data._M_elems[0];
  local_208.data._M_elems[1] = y.m_backend.data._M_elems[1];
  local_208.data._M_elems[2] = y.m_backend.data._M_elems[2];
  local_208.data._M_elems[3] = y.m_backend.data._M_elems[3];
  local_208.exp = y.m_backend.exp;
  local_208.neg = y.m_backend.neg;
  local_208.fpclass = y.m_backend.fpclass;
  local_208.prec_elem = y.m_backend.prec_elem;
LAB_0037195b:
  if (local_230.info != 0) {
    iVar6 = (*(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._vptr_SPxRatioTester[3])();
    bVar5 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isBasic((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(extraout_var_16,iVar6),&enterId);
    if (bVar5) {
      lVar15 = 0xc38;
      if ((-1 < (int)local_29c) || (lVar15 = 0xc40, local_29c = local_2a0, -1 < (int)local_2a0)) {
        iVar6 = (*(this->
                  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._vptr_SPxRatioTester[3])();
        SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::clearNum((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)(*(long *)(CONCAT44(extraout_var_17,iVar6) + lVar15) + 0x68),local_29c);
      }
      DVar9 = (DataKey)selectEnter(this,max,0,false);
      return (SPxId)DVar9;
    }
  }
  *(undefined8 *)((max->m_backend).data._M_elems + 0xc) = local_208.data._M_elems._48_8_;
  *(undefined8 *)((max->m_backend).data._M_elems + 0xe) = local_208.data._M_elems._56_8_;
  *(undefined8 *)((max->m_backend).data._M_elems + 8) = local_208.data._M_elems._32_8_;
  *(undefined8 *)((max->m_backend).data._M_elems + 10) = local_208.data._M_elems._40_8_;
  *(undefined8 *)((max->m_backend).data._M_elems + 4) = local_208.data._M_elems._16_8_;
  *(undefined8 *)((max->m_backend).data._M_elems + 6) = local_208.data._M_elems._24_8_;
  *(undefined8 *)(max->m_backend).data._M_elems = local_208.data._M_elems._0_8_;
  *(undefined8 *)((max->m_backend).data._M_elems + 2) = local_208.data._M_elems._8_8_;
  (max->m_backend).exp = local_208.exp;
  (max->m_backend).neg = local_208.neg;
  (max->m_backend).fpclass = local_208.fpclass;
  (max->m_backend).prec_elem = local_208.prec_elem;
  return (SPxId)enterId.super_DataKey;
}

Assistant:

SPxId SPxDefaultRT<R>::selectEnter(R& max, int, bool)
{
   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   const R*   pvec = this->solver()->pVec().get_const_ptr();
   const R*   pupd = this->solver()->pVec().delta().values();
   const IdxSet& pidx = this->solver()->pVec().idx();
   const R*   lpb  = this->solver()->lpBound().get_const_ptr();
   const R*   upb  = this->solver()->upBound().get_const_ptr();

   const R*   cvec = this->solver()->coPvec().get_const_ptr();
   const R*   cupd = this->solver()->coPvec().delta().values();
   const IdxSet& cidx = this->solver()->coPvec().idx();
   const R*   lcb  = this->solver()->lcBound().get_const_ptr();
   const R*   ucb  = this->solver()->ucBound().get_const_ptr();

   R epsilon = this->solver()->epsilon();
   R val     = max;
   int  pnum    = -1;
   int  cnum    = -1;

   SPxId enterId;
   int   i;
   int   j;
   R  x;

   // PARALLEL the j loops could be parallelized
   if(val > 0)
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y < val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x > epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x > epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }
   else
   {
      for(j = 0; j < pidx.size(); ++j)
      {
         i = pidx.index(j);
         x = pupd[i];

         if(x > epsilon)
         {
            if(lpb[i] > R(-infinity))
            {
               R y = (lpb[i] - pvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(upb[i] < R(infinity))
            {
               R y = (upb[i] - pvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->id(i);
                  val     = y;
                  pnum    = j;
               }
            }
         }
      }

      for(j = 0; j < cidx.size(); ++j)
      {
         i = cidx.index(j);
         x = cupd[i];

         if(x > epsilon)
         {
            if(lcb[i] > R(-infinity))
            {
               R y = (lcb[i] - cvec[i] - this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
         else if(x < -epsilon)
         {
            if(ucb[i] < R(infinity))
            {
               R y = (ucb[i] - cvec[i] + this->delta) / x;

               if(y > val)
               {
                  enterId = this->solver()->coId(i);
                  val     = y;
                  cnum    = j;
               }
            }
         }
      }

      if(cnum >= 0)
      {
         i   = cidx.index(cnum);
         x   = cupd[i];
         val = (x < epsilon) ? ucb[i] : lcb[i];
         val = (val - cvec[i]) / x;
      }
      else if(pnum >= 0)
      {
         i   = pidx.index(pnum);
         x   = pupd[i];
         val = (x < epsilon) ? upb[i] : lpb[i];
         val = (val - pvec[i]) / x;
      }
   }

   if(enterId.isValid() && this->solver()->isBasic(enterId))
   {
      SPxOut::debug(this, "DDEFRT01 isValid() && isBasic(): max={}\n", max);

      if(cnum >= 0)
         this->solver()->coPvec().delta().clearNum(cnum);
      else if(pnum >= 0)
         this->solver()->pVec().delta().clearNum(pnum);

      return SPxDefaultRT<R>::selectEnter(max, 0, false);
   }

   SPX_DEBUG(

      if(!enterId.isValid())
      std::cout << "DDEFRT02 !isValid(): max=" << max << ", x=" << x << std::endl;
   )
      max = val;

   return enterId;
}